

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

void deleteBasisEntries(vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *status,
                       bool *deleted_basic,bool *deleted_nonbasic,
                       HighsIndexCollection *index_collection,HighsInt entry_dim)

{
  pointer pHVar1;
  long lVar2;
  bool *pbVar3;
  HighsInt k;
  int iVar4;
  ulong uVar5;
  HighsInt keep_to_entry;
  HighsInt current_set_entry;
  HighsInt keep_from_entry;
  HighsInt delete_to_entry;
  HighsInt delete_from_entry;
  HighsInt to_k;
  HighsInt from_k;
  HighsInt local_54 [2];
  int local_4c;
  int local_48;
  uint local_44;
  int local_40;
  int local_3c;
  HighsIndexCollection *local_38;
  
  local_38 = index_collection;
  limits(index_collection,&local_3c,&local_40);
  if (local_3c <= local_40) {
    local_54[0] = -1;
    local_54[1] = 0;
    uVar5 = 0;
    *deleted_basic = false;
    *deleted_nonbasic = false;
    iVar4 = local_3c;
    do {
      if (local_40 < iVar4) break;
      updateOutInIndex(local_38,(HighsInt *)&local_44,&local_48,&local_4c,local_54,local_54 + 1);
      pHVar1 = (status->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>).
               _M_impl.super__Vector_impl_data._M_start;
      for (lVar2 = (long)(int)local_44; lVar2 <= local_48; lVar2 = lVar2 + 1) {
        pbVar3 = deleted_nonbasic;
        if (pHVar1[lVar2] == kBasic) {
          pbVar3 = deleted_basic;
        }
        *pbVar3 = true;
      }
      uVar5 = uVar5 & 0xffffffff;
      if (iVar4 == local_3c) {
        uVar5 = (ulong)local_44;
      }
      if (entry_dim + -1 <= local_48) break;
      pHVar1 = (status->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = (ulong)(int)uVar5;
      for (lVar2 = (long)local_4c; lVar2 <= local_54[0]; lVar2 = lVar2 + 1) {
        pHVar1[uVar5] = pHVar1[lVar2];
        uVar5 = uVar5 + 1;
      }
      iVar4 = iVar4 + 1;
    } while (local_54[0] < entry_dim + -1);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (status,(long)(int)uVar5);
  }
  return;
}

Assistant:

void deleteBasisEntries(std::vector<HighsBasisStatus>& status,
                        bool& deleted_basic, bool& deleted_nonbasic,
                        const HighsIndexCollection& index_collection,
                        const HighsInt entry_dim) {
  assert(ok(index_collection));
  assert(static_cast<size_t>(entry_dim) == status.size());
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return;

  HighsInt delete_from_entry;
  HighsInt delete_to_entry;
  HighsInt keep_from_entry;
  HighsInt keep_to_entry = -1;
  HighsInt current_set_entry = 0;
  HighsInt new_num_entry = 0;
  deleted_basic = false;
  deleted_nonbasic = false;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_entry, delete_to_entry,
                     keep_from_entry, keep_to_entry, current_set_entry);
    // Account for the initial entries being kept
    if (k == from_k) new_num_entry = delete_from_entry;
    // Identify whether a basic or a nonbasic entry has been deleted
    for (HighsInt entry = delete_from_entry; entry <= delete_to_entry;
         entry++) {
      if (status[entry] == HighsBasisStatus::kBasic) {
        deleted_basic = true;
      } else {
        deleted_nonbasic = true;
      }
    }
    if (delete_to_entry >= entry_dim - 1) break;
    for (HighsInt entry = keep_from_entry; entry <= keep_to_entry; entry++) {
      status[new_num_entry] = status[entry];
      new_num_entry++;
    }
    if (keep_to_entry >= entry_dim - 1) break;
  }
  status.resize(new_num_entry);
}